

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O0

offset_t __thiscall PEFile::rvaToRaw(PEFile *this,offset_t rva)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 extraout_var;
  SectionHdrWrapper *this_00;
  offset_t oVar3;
  offset_t oVar4;
  ulong uVar5;
  bufsize_t bVar6;
  undefined4 extraout_var_00;
  size_t sVar7;
  bufsize_t rawSize;
  bufsize_t curr;
  offset_t bgnRaw;
  offset_t bgnRVA;
  SectionHdrWrapper *sec;
  undefined1 local_58 [8];
  WatchedLocker lock;
  offset_t rva_local;
  PEFile *this_local;
  
  lock._48_8_ = rva;
  WatchedLocker::WatchedLocker((WatchedLocker *)local_58,&this->m_peMutex,false,"rvaToRaw");
  uVar1 = lock._48_8_;
  iVar2 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xf])(this,2);
  if ((ulong)uVar1 < CONCAT44(extraout_var,iVar2)) {
    this_00 = _getSecHdrAtOffset(this,lock._48_8_,RVA,true,false);
    uVar1 = lock._48_8_;
    if (this_00 == (SectionHdrWrapper *)0x0) {
      iVar2 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0xf])(this,1);
      if ((ulong)uVar1 < CONCAT44(extraout_var_00,iVar2)) {
        sVar7 = _getSectionsCount(this,true);
        uVar1 = lock._48_8_;
        if ((sVar7 == 0) || (bVar6 = hdrsSize(this), (ulong)uVar1 < bVar6)) {
          this_local = (PEFile *)lock._48_8_;
        }
        else {
          this_local = (PEFile *)0xffffffffffffffff;
        }
      }
      else {
        this_local = (PEFile *)0xffffffffffffffff;
      }
    }
    else {
      oVar3 = SectionHdrWrapper::getContentOffset(this_00,RVA,true);
      oVar4 = SectionHdrWrapper::getContentOffset(this_00,RAW,true);
      if ((oVar3 == 0xffffffffffffffff) || (oVar4 == 0xffffffffffffffff)) {
        this_local = (PEFile *)0xffffffffffffffff;
      }
      else {
        uVar5 = lock._48_8_ - oVar3;
        bVar6 = SectionHdrWrapper::getContentSize(this_00,RAW,true);
        if (uVar5 < bVar6) {
          this_local = (PEFile *)(oVar4 + uVar5);
        }
        else {
          this_local = (PEFile *)0xffffffffffffffff;
        }
      }
    }
  }
  else {
    this_local = (PEFile *)0xffffffffffffffff;
  }
  WatchedLocker::~WatchedLocker((WatchedLocker *)local_58);
  return (offset_t)this_local;
}

Assistant:

offset_t PEFile::rvaToRaw(offset_t rva)
{
    WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
    if (rva >= this->getMappedSize(Executable::RVA)) {
        return INVALID_ADDR;
    }
    SectionHdrWrapper* sec = this->_getSecHdrAtOffset(rva, Executable::RVA, true);
    if (sec) {
        offset_t bgnRVA = sec->getContentOffset(Executable::RVA);
        offset_t bgnRaw = sec->getContentOffset(Executable::RAW);
        if (bgnRVA  == INVALID_ADDR || bgnRaw == INVALID_ADDR) {
            return INVALID_ADDR;
        }
        bufsize_t curr = (rva - bgnRVA);
        bufsize_t rawSize = sec->getContentSize(Executable::RAW, true);
        if (curr >= rawSize) {
            // the address might be in a virtual cave that is not related to any raw address
            return INVALID_ADDR;
        }
        return bgnRaw + curr;
    }
    if (rva >= this->getMappedSize(Executable::RAW)) {
        return INVALID_ADDR;
    }
    if (this->_getSectionsCount()) { // do this check only if sections count is non-zero
        if (rva >= this->hdrsSize()) {
            // the address is in the cave between the headers and the first section: cannot be mapped
            return INVALID_ADDR;
        }
    }
    // at this point we are sure that the address is within the raw size:
    return rva;
}